

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.h
# Opt level: O3

void __thiscall
DyndepParser::DyndepParser
          (DyndepParser *this,State *state,FileReader *file_reader,DyndepFile *dyndep_file)

{
  _Rb_tree_header *p_Var1;
  
  (this->super_Parser).state_ = state;
  (this->super_Parser).file_reader_ = file_reader;
  (this->super_Parser).lexer_.filename_.str_ = (char *)0x0;
  (this->super_Parser).lexer_.filename_.len_ = 0;
  (this->super_Parser).lexer_.input_.str_ = (char *)0x0;
  (this->super_Parser).lexer_.input_.len_ = 0;
  (this->super_Parser)._vptr_Parser = (_func_int **)&PTR_Parse_00135998;
  this->dyndep_file_ = dyndep_file;
  (this->env_).super_Env._vptr_Env = (_func_int **)&PTR__BindingEnv_00135a60;
  p_Var1 = &(this->env_).bindings_._M_t._M_impl.super__Rb_tree_header;
  (this->env_).bindings_._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->env_).bindings_._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->env_).bindings_._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->env_).bindings_._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->env_).bindings_._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->env_).rules_._M_t._M_impl.super__Rb_tree_header;
  (this->env_).rules_._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->env_).rules_._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->env_).rules_._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->env_).rules_._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->env_).rules_._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->env_).parent_ = (BindingEnv *)0x0;
  return;
}

Assistant:

Parser(State* state, FileReader* file_reader)
      : state_(state), file_reader_(file_reader) {}